

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_date.cpp
# Opt level: O1

bool cornelich::parse_date(string *date,day_point *dp)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  byte bVar9;
  any_int_parser<int,10u,1u,_1> local_65;
  int d;
  int m;
  int y;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  type context;
  
  context.attributes.car = &y;
  y = 0;
  m = 0;
  d = 0;
  local_58._M_current = (date->_M_dataplus)._M_p;
  local_50._M_current = local_58._M_current + 4;
  bVar2 = boost::spirit::qi::any_int_parser<int,10u,1u,-1>::
          parse<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::spirit::context<boost::fusion::cons<int&,boost::fusion::nil_>,boost::spirit::locals<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::spirit::unused_type,int>
                    (&local_65,&local_58,&local_50,&context,(unused_type *)&boost::spirit::unused,
                     context.attributes.car);
  if (!bVar2) {
    return false;
  }
  pcVar1 = (date->_M_dataplus)._M_p;
  local_58._M_current = pcVar1 + 4;
  local_50._M_current = pcVar1 + 6;
  context.attributes.car = &m;
  bVar2 = boost::spirit::qi::any_int_parser<int,10u,1u,-1>::
          parse<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::spirit::context<boost::fusion::cons<int&,boost::fusion::nil_>,boost::spirit::locals<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::spirit::unused_type,int>
                    (&local_65,&local_58,&local_50,&context,(unused_type *)&boost::spirit::unused,
                     context.attributes.car);
  if (!bVar2) {
    return false;
  }
  pcVar1 = (date->_M_dataplus)._M_p;
  local_58._M_current = pcVar1 + 6;
  local_50._M_current = pcVar1 + 8;
  context.attributes.car = &d;
  bVar2 = boost::spirit::qi::any_int_parser<int,10u,1u,-1>::
          parse<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::spirit::context<boost::fusion::cons<int&,boost::fusion::nil_>,boost::spirit::locals<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::spirit::unused_type,int>
                    (&local_65,&local_58,&local_50,&context,(unused_type *)&boost::spirit::unused,
                     context.attributes.car);
  if (!bVar2) {
    return false;
  }
  uVar8 = m & 0xff;
  iVar4 = (int)(short)y;
  bVar9 = (byte)m;
  iVar5 = iVar4 - (uint)(bVar9 < 3);
  iVar7 = uVar8 - 3;
  if (bVar9 < 3) {
    iVar7 = uVar8 + 9;
  }
  iVar3 = iVar5 + -399;
  if (-1 < iVar5) {
    iVar3 = iVar5;
  }
  uVar6 = (iVar3 / 400) * -400 + iVar5;
  (dp->__d).__r =
       (((iVar7 * 0x99 + 2U) / 5 + (d & 0xffU) + (iVar3 / 400) * 0x23ab1 + (uVar6 >> 2) +
        uVar6 * 0x16d) - uVar6 / 100) + -0xafa6d;
  if ((byte)d == 0 || (byte)(bVar9 - 0xd) < 0xf4) {
    return false;
  }
  if ((y & 3U) == 0 && bVar9 == 2) {
    bVar9 = 0x1d;
    if ((iVar4 % 100 != 0) || (iVar4 % 400 == 0)) goto LAB_00134eeb;
  }
  bVar9 = (&DAT_001651d2)[uVar8 - 1];
LAB_00134eeb:
  return (byte)d <= bVar9;
}

Assistant:

bool parse_date(const std::string & date, day_point & dp)
{
    int y = 0, m = 0, d = 0;
    if(BOOST_UNLIKELY(
                !util::parse_number(date.begin(), date.begin() + 4, y) ||
                !util::parse_number(date.begin() + 4, date.begin() + 6, m) ||
                !util::parse_number(date.begin() + 6, date.begin() + 8, d)))
    {
        return false;
    }
    auto ymd = year(y)/m/d;
    dp = ymd;
    return ymd.ok();
}